

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_visitor.h
# Opt level: O1

void __thiscall
google::protobuf::internal::
VisitImpl<google::protobuf::internal::VisitorImpl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/mock_code_generator.cc:234:39)>_>
::Visit<>(VisitImpl<google::protobuf::internal::VisitorImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_compiler_mock_code_generator_cc:234:39)>_>
          *this,Descriptor *descriptor)

{
  bool bVar1;
  MessageLite *pMVar2;
  Descriptor *descriptor_00;
  long lVar3;
  ExtensionSet *pEVar4;
  long lVar5;
  string_view str;
  string_view str_00;
  string_view str_01;
  string_view str_02;
  string_view str_03;
  string_view str_04;
  string_view str_05;
  string_view str_06;
  string_view str_07;
  LogMessage local_70;
  LogMessage local_60;
  LogMessage local_50;
  LogMessage local_40;
  
  pEVar4 = (ExtensionSet *)(*(long *)(this + 0x38) + 0x10);
  bVar1 = ExtensionSet::Has(pEVar4,pb::test);
  if (!bVar1) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_40,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/mock_code_generator.cc"
               ,0xec,"features.HasExtension(pb::test)");
    str_05._M_str = "Test features were not resolved properly";
    str_05._M_len = 0x28;
    absl::lts_20250127::log_internal::LogMessage::
    CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
              (&local_40,str_05);
    if (!bVar1) {
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_40);
    }
  }
  pMVar2 = ExtensionSet::GetMessage
                     (pEVar4,pb::test,(MessageLite *)PTR__TestFeatures_default_instance__00590eb8);
  if (((ulong)pMVar2[1]._vptr_MessageLite & 1) == 0) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_70,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/mock_code_generator.cc"
               ,0xee,"features.GetExtension(pb::test).has_file_feature()");
    str_06._M_str = "Test features were not resolved properly";
    str_06._M_len = 0x28;
    absl::lts_20250127::log_internal::LogMessage::
    CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
              (&local_70,str_06);
  }
  else {
    descriptor_00 = (Descriptor *)(ulong)pb::test;
    pMVar2 = ExtensionSet::GetMessage
                       (pEVar4,pb::test,(MessageLite *)PTR__TestFeatures_default_instance__00590eb8)
    ;
    if (((ulong)pMVar2[1]._vptr_MessageLite & 0x800) != 0) {
      if (0 < *(int *)(this + 0x8c)) {
        lVar5 = 0;
        lVar3 = 0;
        do {
          Visit<>((VisitImpl<google::protobuf::internal::VisitorImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_compiler_mock_code_generator_cc:234:39)>_>
                   *)(*(long *)(this + 0x58) + lVar5),(EnumDescriptor *)descriptor_00);
          lVar3 = lVar3 + 1;
          lVar5 = lVar5 + 0x58;
        } while (lVar3 < *(int *)(this + 0x8c));
      }
      if (0 < *(int *)(this + 0x80)) {
        lVar3 = 0x28;
        lVar5 = 0;
        do {
          pEVar4 = (ExtensionSet *)(*(long *)(*(long *)(this + 0x48) + lVar3) + 0x10);
          bVar1 = ExtensionSet::Has(pEVar4,pb::test);
          if (!bVar1) {
            absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                      ((LogMessageFatal *)&local_50,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/mock_code_generator.cc"
                       ,0xec,"features.HasExtension(pb::test)");
            str._M_str = "Test features were not resolved properly";
            str._M_len = 0x28;
            absl::lts_20250127::log_internal::LogMessage::
            CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                      (&local_50,str);
            if (!bVar1) {
              absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                        ((LogMessageFatal *)&local_50);
            }
          }
          pMVar2 = ExtensionSet::GetMessage
                             (pEVar4,pb::test,
                              (MessageLite *)PTR__TestFeatures_default_instance__00590eb8);
          if (((ulong)pMVar2[1]._vptr_MessageLite & 1) == 0) {
            absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                      ((LogMessageFatal *)&local_70,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/mock_code_generator.cc"
                       ,0xee,"features.GetExtension(pb::test).has_file_feature()");
            str_01._M_str = "Test features were not resolved properly";
            str_01._M_len = 0x28;
            absl::lts_20250127::log_internal::LogMessage::
            CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                      (&local_70,str_01);
            goto LAB_001b7222;
          }
          descriptor_00 = (Descriptor *)(ulong)pb::test;
          pMVar2 = ExtensionSet::GetMessage
                             (pEVar4,pb::test,
                              (MessageLite *)PTR__TestFeatures_default_instance__00590eb8);
          if (((ulong)pMVar2[1]._vptr_MessageLite & 0x800) == 0) {
            absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                      ((LogMessageFatal *)&local_70,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/mock_code_generator.cc"
                       ,0xf0,"features.GetExtension(pb::test).has_source_feature()");
            str_02._M_str = "Test features were not resolved properly";
            str_02._M_len = 0x28;
            absl::lts_20250127::log_internal::LogMessage::
            CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                      (&local_70,str_02);
            goto LAB_001b7222;
          }
          lVar5 = lVar5 + 1;
          lVar3 = lVar3 + 0x38;
        } while (lVar5 < *(int *)(this + 0x80));
      }
      if (0 < *(int *)(this + 8)) {
        lVar5 = 0;
        lVar3 = 0;
        do {
          Visit<>((VisitImpl<google::protobuf::internal::VisitorImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_compiler_mock_code_generator_cc:234:39)>_>
                   *)(*(long *)(this + 0x40) + lVar5),(FieldDescriptor *)descriptor_00);
          lVar3 = lVar3 + 1;
          lVar5 = lVar5 + 0x58;
        } while (lVar3 < *(int *)(this + 8));
      }
      if (0 < *(int *)(this + 0x88)) {
        lVar5 = 0;
        lVar3 = 0;
        do {
          Visit<>((VisitImpl<google::protobuf::internal::VisitorImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_compiler_mock_code_generator_cc:234:39)>_>
                   *)(*(long *)(this + 0x50) + lVar5),descriptor_00);
          lVar3 = lVar3 + 1;
          lVar5 = lVar5 + 0xa0;
        } while (lVar3 < *(int *)(this + 0x88));
      }
      if (0 < *(int *)(this + 0x94)) {
        lVar5 = 0;
        lVar3 = 0;
        do {
          Visit<>((VisitImpl<google::protobuf::internal::VisitorImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_compiler_mock_code_generator_cc:234:39)>_>
                   *)(*(long *)(this + 0x68) + lVar5),(FieldDescriptor *)descriptor_00);
          lVar3 = lVar3 + 1;
          lVar5 = lVar5 + 0x58;
        } while (lVar3 < *(int *)(this + 0x94));
      }
      if (0 < *(int *)(this + 0x90)) {
        lVar3 = 0x20;
        lVar5 = 0;
        do {
          pEVar4 = (ExtensionSet *)(*(long *)(*(long *)(this + 0x60) + lVar3) + 0x10);
          bVar1 = ExtensionSet::Has(pEVar4,pb::test);
          if (!bVar1) {
            absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                      ((LogMessageFatal *)&local_70,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/mock_code_generator.cc"
                       ,0xec,"features.HasExtension(pb::test)");
            str_00._M_str = "Test features were not resolved properly";
            str_00._M_len = 0x28;
            absl::lts_20250127::log_internal::LogMessage::
            CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                      (&local_70,str_00);
            if (!bVar1) goto LAB_001b7222;
          }
          pMVar2 = ExtensionSet::GetMessage
                             (pEVar4,pb::test,
                              (MessageLite *)PTR__TestFeatures_default_instance__00590eb8);
          if (((ulong)pMVar2[1]._vptr_MessageLite & 1) == 0) {
            absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                      ((LogMessageFatal *)&local_60,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/mock_code_generator.cc"
                       ,0xee,"features.GetExtension(pb::test).has_file_feature()");
            str_03._M_str = "Test features were not resolved properly";
            str_03._M_len = 0x28;
            absl::lts_20250127::log_internal::LogMessage::
            CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                      (&local_60,str_03);
LAB_001b7216:
            absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                      ((LogMessageFatal *)&local_60);
          }
          pMVar2 = ExtensionSet::GetMessage
                             (pEVar4,pb::test,
                              (MessageLite *)PTR__TestFeatures_default_instance__00590eb8);
          if (((ulong)pMVar2[1]._vptr_MessageLite & 0x800) == 0) {
            absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                      ((LogMessageFatal *)&local_60,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/mock_code_generator.cc"
                       ,0xf0,"features.GetExtension(pb::test).has_source_feature()");
            str_04._M_str = "Test features were not resolved properly";
            str_04._M_len = 0x28;
            absl::lts_20250127::log_internal::LogMessage::
            CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                      (&local_60,str_04);
            goto LAB_001b7216;
          }
          lVar5 = lVar5 + 1;
          lVar3 = lVar3 + 0x28;
        } while (lVar5 < *(int *)(this + 0x90));
      }
      return;
    }
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_70,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/mock_code_generator.cc"
               ,0xf0,"features.GetExtension(pb::test).has_source_feature()");
    str_07._M_str = "Test features were not resolved properly";
    str_07._M_len = 0x28;
    absl::lts_20250127::log_internal::LogMessage::
    CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
              (&local_70,str_07);
  }
LAB_001b7222:
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_70);
}

Assistant:

void Visit(const Descriptor& descriptor, Proto&... proto) {
    visitor(descriptor, proto...);

    for (int i = 0; i < descriptor.enum_type_count(); i++) {
      Visit(*descriptor.enum_type(i), enum_type(proto, i)...);
    }

    for (int i = 0; i < descriptor.oneof_decl_count(); i++) {
      Visit(*descriptor.oneof_decl(i), oneof_decl(proto, i)...);
    }

    for (int i = 0; i < descriptor.field_count(); i++) {
      Visit(*descriptor.field(i), field(proto, i)...);
    }

    for (int i = 0; i < descriptor.nested_type_count(); i++) {
      Visit(*descriptor.nested_type(i), nested_type(proto, i)...);
    }

    for (int i = 0; i < descriptor.extension_count(); i++) {
      Visit(*descriptor.extension(i), extension(proto, i)...);
    }

    for (int i = 0; i < descriptor.extension_range_count(); i++) {
      Visit(*descriptor.extension_range(i), extension_range(proto, i)...);
    }
  }